

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.hpp
# Opt level: O2

string * tao::pegtl::internal::demangle<queryparse::string_content>(void)

{
  char *in_RDX;
  string *in_RDI;
  
  demangle_abi_cxx11_(in_RDI,(internal *)"N10queryparse14string_contentE",in_RDX);
  return in_RDI;
}

Assistant:

std::string demangle()
         {
            return demangle( typeid( T ).name() );
         }